

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int VmHashFuncStep(SyHashEntry *pEntry,void *pUserData)

{
  sxi32 sVar1;
  jx9_value sName;
  anon_union_8_3_18420de5_for_x local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_48 = *(undefined8 *)((long)pUserData + 0x10);
  uStack_20 = 0;
  local_58.rVal = 0.0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_50 = 1;
  uStack_40 = local_48;
  jx9MemObjStringAppend((jx9_value *)&local_58,(char *)pEntry->pKey,pEntry->nKeyLen);
  sVar1 = -0x18;
  if ((*(byte *)((long)pUserData + 8) & 0x40) != 0) {
    sVar1 = HashmapInsert(*pUserData,(jx9_value *)0x0,(jx9_value *)&local_58);
  }
  jx9MemObjRelease((jx9_value *)&local_58);
  return sVar1;
}

Assistant:

static int VmHashFuncStep(SyHashEntry *pEntry, void *pUserData)
{
	jx9_value *pArray = (jx9_value *)pUserData;
	jx9_value sName;
	sxi32 rc;
	/* Prepare the function name for insertion */
	jx9MemObjInitFromString(pArray->pVm, &sName, 0);
	jx9MemObjStringAppend(&sName, (const char *)pEntry->pKey, pEntry->nKeyLen);
	/* Perform the insertion */
	rc = jx9_array_add_elem(pArray, 0/* Automatic index assign */, &sName); /* Will make it's own copy */
	jx9MemObjRelease(&sName);
	return rc;
}